

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O0

void duckdb::ConstantFillFunction<duckdb::hugeint_t>
               (ColumnSegment *segment,Vector *result,idx_t start_idx,idx_t count)

{
  hugeint_t *phVar1;
  ulong in_RCX;
  long in_RDX;
  hugeint_t hVar2;
  idx_t i;
  hugeint_t constant_value;
  hugeint_t *data;
  BaseStatistics *nstats;
  ulong local_48;
  uint64_t local_40;
  int64_t local_38;
  
  phVar1 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xa3cd70);
  hVar2 = NumericStats::GetMin<duckdb::hugeint_t>(nstats);
  for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
    local_40 = hVar2.lower;
    phVar1[in_RDX + local_48].lower = local_40;
    local_38 = hVar2.upper;
    phVar1[in_RDX + local_48].upper = local_38;
  }
  return;
}

Assistant:

void ConstantFillFunction(ColumnSegment &segment, Vector &result, idx_t start_idx, idx_t count) {
	auto &nstats = segment.stats.statistics;

	auto data = FlatVector::GetData<T>(result);
	auto constant_value = NumericStats::GetMin<T>(nstats);
	for (idx_t i = 0; i < count; i++) {
		data[start_idx + i] = constant_value;
	}
}